

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtoumax.c
# Opt level: O2

int main(void)

{
  int *piVar1;
  uintmax_t uVar2;
  char *endptr;
  char tricky [5];
  char overflow [55];
  
  builtin_strncpy(overflow,"-ZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZ_",0x37);
  builtin_strncpy(tricky,"+0xz",5);
  piVar1 = __errno_location();
  *piVar1 = 0;
  uVar2 = strtoumax("123",(char **)0x0,10);
  if (uVar2 != 0x7b) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/inttypes/strtoumax.c, line %d - %s\n"
           ,0x34,"strtoumax( \"123\", NULL, 10 ) == 123");
  }
  uVar2 = strtoumax("456",(char **)0x0,0);
  if (uVar2 != 0x1c8) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/inttypes/strtoumax.c, line %d - %s\n"
           ,0x36,"strtoumax( \"456\", NULL, 0 ) == 456");
  }
  uVar2 = strtoumax("14",(char **)0x0,8);
  if (uVar2 != 0xc) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/inttypes/strtoumax.c, line %d - %s\n"
           ,0x38,"strtoumax( \"14\", NULL, 8 ) == 12");
  }
  uVar2 = strtoumax("016",(char **)0x0,0);
  if (uVar2 != 0xe) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/inttypes/strtoumax.c, line %d - %s\n"
           ,0x3a,"strtoumax( \"016\", NULL, 0 ) == 14");
  }
  uVar2 = strtoumax("0xFF",(char **)0x0,0);
  if (uVar2 != 0xff) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/inttypes/strtoumax.c, line %d - %s\n"
           ,0x3c,"strtoumax( \"0xFF\", NULL, 0 ) == 255");
  }
  uVar2 = strtoumax("0Xa1",(char **)0x0,0);
  if (uVar2 != 0xa1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/inttypes/strtoumax.c, line %d - %s\n"
           ,0x3e,"strtoumax( \"0Xa1\", NULL, 0 ) == 161");
  }
  uVar2 = strtoumax(tricky,&endptr,0);
  if (uVar2 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/inttypes/strtoumax.c, line %d - %s\n"
           ,0x40,"strtoumax( tricky, &endptr, 0 ) == 0");
  }
  uVar2 = strtoumax(tricky,&endptr,8);
  if (uVar2 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/inttypes/strtoumax.c, line %d - %s\n"
           ,0x44,"strtoumax( tricky, &endptr, 8 ) == 0");
  }
  if (endptr != tricky + 2) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/inttypes/strtoumax.c, line %d - %s\n"
           ,0x45,"endptr == tricky + 2");
  }
  if (*piVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/inttypes/strtoumax.c, line %d - %s\n"
           ,0x47,"errno == 0");
  }
  uVar2 = strtoumax(overflow,&endptr,0x24);
  if (uVar2 != 0xffffffffffffffff) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/inttypes/strtoumax.c, line %d - %s\n"
           ,0x49,"strtoumax( overflow, &endptr, 36 ) == UINTMAX_MAX");
  }
  if (*piVar1 != 0x22) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/inttypes/strtoumax.c, line %d - %s\n"
           ,0x4a,"errno == ERANGE");
  }
  if ((long)endptr - (long)overflow != 0x35) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/inttypes/strtoumax.c, line %d - %s\n"
           ,0x4b,"( endptr - overflow ) == 53");
  }
  *piVar1 = 0;
  uVar2 = strtoumax(overflow + 1,&endptr,0x24);
  if (uVar2 != 0xffffffffffffffff) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/inttypes/strtoumax.c, line %d - %s\n"
           ,0x4e,"strtoumax( overflow + 1, &endptr, 36 ) == UINTMAX_MAX");
  }
  if (*piVar1 != 0x22) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/inttypes/strtoumax.c, line %d - %s\n"
           ,0x4f,"errno == ERANGE");
  }
  if ((long)endptr - (long)overflow != 0x35) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/inttypes/strtoumax.c, line %d - %s\n"
           ,0x50,"( endptr - overflow ) == 53");
  }
  uVar2 = strtoumax(" \n\v\t\f789",(char **)0x0,0);
  if (uVar2 != 0x315) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/inttypes/strtoumax.c, line %d - %s\n"
           ,0x52,"strtoumax( \" \\n\\v\\t\\f789\", NULL, 0 ) == 789");
  }
  uVar2 = strtoumax(overflow,&endptr,10);
  if (uVar2 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/inttypes/strtoumax.c, line %d - %s\n"
           ,0x54,"strtoumax( overflow, &endptr, 10 ) == 0");
  }
  if (endptr != overflow) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/inttypes/strtoumax.c, line %d - %s\n"
           ,0x55,"endptr == overflow");
  }
  endptr = (char *)0x0;
  uVar2 = strtoumax(overflow,&endptr,0);
  if (uVar2 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/inttypes/strtoumax.c, line %d - %s\n"
           ,0x57,"strtoumax( overflow, &endptr, 0 ) == 0");
  }
  if (endptr != overflow) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/inttypes/strtoumax.c, line %d - %s\n"
           ,0x58,"endptr == overflow");
  }
  *piVar1 = 0;
  uVar2 = strtoumax("18446744073709551615",(char **)0x0,0);
  if (uVar2 != 0xffffffffffffffff) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/inttypes/strtoumax.c, line %d - %s\n"
           ,0x5d,"strtoumax( \"18446744073709551615\", NULL, 0 ) == UINTMAX_MAX");
  }
  if (*piVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/inttypes/strtoumax.c, line %d - %s\n"
           ,0x5e,"errno == 0");
  }
  uVar2 = strtoumax("18446744073709551616",(char **)0x0,0);
  if (uVar2 != 0xffffffffffffffff) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/inttypes/strtoumax.c, line %d - %s\n"
           ,0x5f,"strtoumax( \"18446744073709551616\", NULL, 0 ) == UINTMAX_MAX");
  }
  if (*piVar1 != 0x22) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/inttypes/strtoumax.c, line %d - %s\n"
           ,0x60,"errno == ERANGE");
  }
  *piVar1 = 0;
  uVar2 = strtoumax("0xFFFFFFFFFFFFFFFF",(char **)0x0,0);
  if (uVar2 != 0xffffffffffffffff) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/inttypes/strtoumax.c, line %d - %s\n"
           ,99,"strtoumax( \"0xFFFFFFFFFFFFFFFF\", NULL, 0 ) == UINTMAX_MAX");
  }
  if (*piVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/inttypes/strtoumax.c, line %d - %s\n"
           ,100,"errno == 0");
  }
  uVar2 = strtoumax("0x10000000000000000",(char **)0x0,0);
  if (uVar2 != 0xffffffffffffffff) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/inttypes/strtoumax.c, line %d - %s\n"
           ,0x65,"strtoumax( \"0x10000000000000000\", NULL, 0 ) == UINTMAX_MAX");
  }
  if (*piVar1 != 0x22) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/inttypes/strtoumax.c, line %d - %s\n"
           ,0x66,"errno == ERANGE");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    char * endptr;
    /* this, to base 36, overflows even a 256 bit integer */
    char overflow[] = "-ZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZ_";
    /* tricky border case */
    char tricky[] = "+0xz";
    errno = 0;
    /* basic functionality */
    TESTCASE( strtoumax( "123", NULL, 10 ) == 123 );
    /* proper detecting of default base 10 */
    TESTCASE( strtoumax( "456", NULL, 0 ) == 456 );
    /* proper functioning to smaller base */
    TESTCASE( strtoumax( "14", NULL, 8 ) == 12 );
    /* proper autodetecting of octal */
    TESTCASE( strtoumax( "016", NULL, 0 ) == 14 );
    /* proper autodetecting of hexadecimal, lowercase 'x' */
    TESTCASE( strtoumax( "0xFF", NULL, 0 ) == 255 );
    /* proper autodetecting of hexadecimal, uppercase 'X' */
    TESTCASE( strtoumax( "0Xa1", NULL, 0 ) == 161 );
    /* proper handling of border case: 0x followed by non-hexdigit */
    TESTCASE( strtoumax( tricky, &endptr, 0 ) == 0 );
    /* newlib completely balks at this parse, so we _NOREG it */
    TESTCASE_NOREG( endptr == tricky + 2 );
    /* proper handling of border case: 0 followed by non-octdigit */
    TESTCASE( strtoumax( tricky, &endptr, 8 ) == 0 );
    TESTCASE( endptr == tricky + 2 );
    /* errno should still be 0 */
    TESTCASE( errno == 0 );
    /* overflowing subject sequence must still return proper endptr */
    TESTCASE( strtoumax( overflow, &endptr, 36 ) == UINTMAX_MAX );
    TESTCASE( errno == ERANGE );
    TESTCASE( ( endptr - overflow ) == 53 );
    /* same for positive */
    errno = 0;
    TESTCASE( strtoumax( overflow + 1, &endptr, 36 ) == UINTMAX_MAX );
    TESTCASE( errno == ERANGE );
    TESTCASE( ( endptr - overflow ) == 53 );
    /* testing skipping of leading whitespace */
    TESTCASE( strtoumax( " \n\v\t\f789", NULL, 0 ) == 789 );
    /* testing conversion failure */
    TESTCASE( strtoumax( overflow, &endptr, 10 ) == 0 );
    TESTCASE( endptr == overflow );
    endptr = NULL;
    TESTCASE( strtoumax( overflow, &endptr, 0 ) == 0 );
    TESTCASE( endptr == overflow );
    errno = 0;
/* uintmax_t -> long long -> 64 bit */
#if UINTMAX_MAX >> 63 == 1
    /* testing "odd" overflow, i.e. base is not power of two */
    TESTCASE( strtoumax( "18446744073709551615", NULL, 0 ) == UINTMAX_MAX );
    TESTCASE( errno == 0 );
    TESTCASE( strtoumax( "18446744073709551616", NULL, 0 ) == UINTMAX_MAX );
    TESTCASE( errno == ERANGE );
    /* testing "even" overflow, i.e. base is power of two */
    errno = 0;
    TESTCASE( strtoumax( "0xFFFFFFFFFFFFFFFF", NULL, 0 ) == UINTMAX_MAX );
    TESTCASE( errno == 0 );
    TESTCASE( strtoumax( "0x10000000000000000", NULL, 0 ) == UINTMAX_MAX );
    TESTCASE( errno == ERANGE );
/* uintmax_t -> long long -> 128 bit */
#elif UINTMAX_MAX >> 127 == 1
    /* testing "odd" overflow, i.e. base is not power of two */
    TESTCASE( strtoumax( "340282366920938463463374607431768211455", NULL, 0 ) == UINTMAX_MAX );
    TESTCASE( errno == 0 );
    TESTCASE( strtoumax( "340282366920938463463374607431768211456", NULL, 0 ) == UINTMAX_MAX );
    TESTCASE( errno == ERANGE );
    /* testing "even" everflow, i.e. base is power of two */
    errno = 0;
    TESTCASE( strtoumax( "0xFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFF", NULL, 0 ) == UINTMAX_MAX );
    TESTCASE( errno == 0 );
    TESTCASE( strtoumax( "0x100000000000000000000000000000000", NULL, 0 ) == UINTMAX_MAX );
    TESTCASE( errno == ERANGE );
#else
#error Unsupported width of 'uintmax_t' (neither 64 nor 128 bit).
#endif
    return TEST_RESULTS;
}